

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_element_access_at_Test::TestBody(VectorSUnitTest_element_access_at_Test *this)

{
  bool bVar1;
  reference pvVar2;
  const_reference pvVar3;
  char *pcVar4;
  vector_s<unsigned_int,_5UL> vc;
  vector_s<unsigned_int,_5UL> v;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  long local_a8;
  _Alloc_hider _Stack_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [8];
  char *pcStack_70;
  long local_68 [4];
  vector_s<unsigned_int,_5UL> local_48;
  
  local_b8 = (undefined1  [8])local_78;
  local_78 = (undefined1  [8])0x100000000;
  pcStack_70 = &DAT_300000002;
  local_68[0] = CONCAT44(local_68[0]._4_4_,4);
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  estl::vector_s<unsigned_int,_5UL>::vector_s(&local_48,(initializer_list<unsigned_int> *)local_b8);
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"0u","v.at(0)",(uint *)local_b8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x150,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_b8._0_4_ = 1;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"1u","v.at(1)",(uint *)local_b8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x151,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_b8._0_4_ = 2;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"2u","v.at(2)",(uint *)local_b8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x152,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_b8._0_4_ = 3;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"3u","v.at(3)",(uint *)local_b8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x153,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_b8._0_4_ = 4;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"4u","v.at(4)",(uint *)local_b8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x154,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_68[0] = 0;
  local_68[1]._0_1_ = '\0';
  local_68[1]._1_1_ = '\0';
  local_68[1]._2_1_ = '\0';
  local_68[1]._3_1_ = '\0';
  local_68[1]._4_4_ = 0;
  pcStack_70 = (char *)0x0;
  local_78 = (undefined1  [8])local_68;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    estl::vector_s<unsigned_int,_5UL>::at(&local_48,5);
  }
  std::__cxx11::string::_M_replace((ulong)local_78,0,pcStack_70,0x158262);
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
             ,0x155,(char *)local_78);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
  if (local_b8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_b8 + 8))();
  }
  if (local_78 != (undefined1  [8])local_68) {
    operator_delete((void *)local_78,local_68[0] + 1);
  }
  local_b8 = (undefined1  [8])0x100000000;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_300000002;
  local_a8 = CONCAT44(local_a8._4_4_,4);
  local_98._8_8_ = 5;
  local_98._0_8_ = (AssertHelperData *)local_b8;
  estl::vector_s<unsigned_int,_5UL>::vector_s
            ((vector_s<unsigned_int,_5UL> *)local_78,(initializer_list<unsigned_int> *)local_98);
  local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b8,"0u","vc.at(0)",(uint *)local_98,pvVar3);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x159,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_98._0_4_ = 1;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b8,"1u","vc.at(1)",(uint *)local_98,pvVar3);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_98._0_4_ = 2;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b8,"2u","vc.at(2)",(uint *)local_98,pvVar3);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_98._0_4_ = 3;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b8,"3u","vc.at(3)",(uint *)local_98,pvVar3);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_98._0_4_ = 4;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b8,"4u","vc.at(4)",(uint *)local_98,pvVar3);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_a8 = 0;
  _Stack_a0._M_p = (pointer)0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (undefined1  [8])&local_a8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,5);
  }
  std::__cxx11::string::_M_replace((ulong)local_b8,0,(char *)pbStack_b0,0x1583ac);
  testing::Message::Message((Message *)local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
             ,0x15e,(char *)local_b8);
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_98._0_8_ + 8))();
  }
  if (local_b8 != (undefined1  [8])&local_a8) {
    operator_delete((void *)local_b8,local_a8 + 1);
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_at)
{
    vector_s<unsigned, 5> v{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, v.at(0));
    EXPECT_EQ(1u, v.at(1));
    EXPECT_EQ(2u, v.at(2));
    EXPECT_EQ(3u, v.at(3));
    EXPECT_EQ(4u, v.at(4));
    EXPECT_THROW(v.at(5), std::out_of_range);

    // const variant of at()
    const vector_s<unsigned, 5> vc{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, vc.at(0));
    EXPECT_EQ(1u, vc.at(1));
    EXPECT_EQ(2u, vc.at(2));
    EXPECT_EQ(3u, vc.at(3));
    EXPECT_EQ(4u, vc.at(4));
    EXPECT_THROW(vc.at(5), std::out_of_range);
}